

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  Index index_00;
  iterator right;
  bool bVar1;
  pointer ppVar2;
  Binary *pBVar3;
  LocalGet *pLVar4;
  LocalSet *left;
  Block *expression;
  optional<wasm::Type> type;
  optional<wasm::Type> local_68;
  Type local_58;
  Builder local_50;
  Builder builder;
  Expression *value;
  Expression **target;
  Binary *binary;
  iterator iStack_28;
  uint index;
  _Self local_20;
  iterator iter;
  LocalSet *curr_local;
  Creator *this_local;
  
  iter._M_node = (_Base_ptr)curr;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
       ::find(*(map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
                **)((long)this + 0xd8),(key_type *)&iter);
  iStack_28 = std::
              map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
              ::end(*(map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
                      **)((long)this + 0xd8));
  bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd8);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>::operator->
                       (&local_20);
    index_00 = ppVar2->second;
    pBVar3 = Expression::cast<wasm::Binary>((Expression *)(iter._M_node)->_M_right);
    bVar1 = Expression::is<wasm::Const>(pBVar3->left);
    if (bVar1) {
      value = (Expression *)&pBVar3->right;
    }
    else {
      bVar1 = Expression::is<wasm::Const>(pBVar3->right);
      if (!bVar1) {
        __assert_fail("binary->right->is<Const>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                      ,0x1b0,
                      "void wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(LocalSet *)"
                     );
      }
      value = (Expression *)&pBVar3->left;
    }
    builder.wasm = *(Module **)value;
    Builder::Builder(&local_50,*(Module **)((long)this + 0xe0));
    wasm::Type::Type(&local_58,i32);
    pLVar4 = Builder::makeLocalGet(&local_50,index_00,local_58);
    *(LocalGet **)value = pLVar4;
    left = Builder::makeLocalSet(&local_50,index_00,(Expression *)builder.wasm);
    right = iter;
    std::optional<wasm::Type>::optional(&local_68);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    expression = Builder::makeSequence
                           (&local_50,(Expression *)left,(Expression *)right._M_node,type);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::replaceCurrent
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)this,(Expression *)expression);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }